

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O0

int ecp_mod_p255(mbedtls_mpi *N)

{
  undefined1 local_78 [8];
  mbedtls_mpi_uint Mp [6];
  undefined1 local_40 [8];
  mbedtls_mpi M;
  size_t i;
  int ret;
  mbedtls_mpi *N_local;
  
  if (N->n < 4) {
    N_local._4_4_ = 0;
  }
  else {
    local_40._0_4_ = 1;
    M._0_8_ = N->n - 3;
    if (5 < (ulong)M._0_8_) {
      M.s = 5;
      M._4_4_ = 0;
    }
    M.n = (size_t)local_78;
    memset(local_78,0,0x30);
    memcpy(local_78,N->p + 3,M._0_8_ << 3);
    i._4_4_ = mbedtls_mpi_shift_r((mbedtls_mpi *)local_40,0x3f);
    if (i._4_4_ == 0) {
      M._0_8_ = M._0_8_ + 1;
      i._4_4_ = mbedtls_mpi_set_bit(N,0xff,'\0');
      if (i._4_4_ == 0) {
        for (M.p = (mbedtls_mpi_uint *)0x4; M.p < (mbedtls_mpi_uint *)N->n;
            M.p = (mbedtls_mpi_uint *)((long)M.p + 1)) {
          N->p[(long)M.p] = 0;
        }
        i._4_4_ = mbedtls_mpi_mul_int((mbedtls_mpi *)local_40,(mbedtls_mpi *)local_40,0x13);
        if (i._4_4_ == 0) {
          i._4_4_ = mbedtls_mpi_add_abs(N,N,(mbedtls_mpi *)local_40);
        }
      }
    }
    N_local._4_4_ = i._4_4_;
  }
  return N_local._4_4_;
}

Assistant:

static int ecp_mod_p255( mbedtls_mpi *N )
{
    int ret;
    size_t i;
    mbedtls_mpi M;
    mbedtls_mpi_uint Mp[P255_WIDTH + 2];

    if( N->n < P255_WIDTH )
        return( 0 );

    /* M = A1 */
    M.s = 1;
    M.n = N->n - ( P255_WIDTH - 1 );
    if( M.n > P255_WIDTH + 1 )
        M.n = P255_WIDTH + 1;
    M.p = Mp;
    memset( Mp, 0, sizeof Mp );
    memcpy( Mp, N->p + P255_WIDTH - 1, M.n * sizeof( mbedtls_mpi_uint ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &M, 255 % ( 8 * sizeof( mbedtls_mpi_uint ) ) ) );
    M.n++; /* Make room for multiplication by 19 */

    /* N = A0 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( N, 255, 0 ) );
    for( i = P255_WIDTH; i < N->n; i++ )
        N->p[i] = 0;

    /* N = A0 + 19 * A1 */
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_int( &M, &M, 19 ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_add_abs( N, N, &M ) );

cleanup:
    return( ret );
}